

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mutex.h
# Opt level: O2

void __thiscall FIX::Mutex::lock(Mutex *this)

{
  int iVar1;
  pthread_t pVar2;
  pthread_t pVar3;
  
  iVar1 = *(int *)(this + 0x30);
  if ((iVar1 != 0) && (pVar3 = *(pthread_t *)(this + 0x28), pVar2 = pthread_self(), pVar3 == pVar2))
  {
    *(int *)(this + 0x30) = iVar1 + 1;
    return;
  }
  pthread_mutex_lock((pthread_mutex_t *)this);
  *(int *)(this + 0x30) = *(int *)(this + 0x30) + 1;
  pVar3 = pthread_self();
  *(pthread_t *)(this + 0x28) = pVar3;
  return;
}

Assistant:

void lock() {
#ifdef _MSC_VER
    EnterCriticalSection(&m_mutex);
#else
    if (m_count && m_threadID == pthread_self()) {
      ++m_count;
      return;
    }
    pthread_mutex_lock(&m_mutex);
    ++m_count;
    m_threadID = pthread_self();
#endif
  }